

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O1

deBool deSocket_shutdown(deSocket *sock,deUint32 channels)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  deBool dVar4;
  uint __how;
  uint uVar5;
  uint uVar6;
  
  deMutex_lock(sock->stateLock);
  dVar4 = 0;
  if (((sock->state != DE_SOCKETSTATE_DISCONNECTED) &&
      (dVar4 = 0, sock->state != DE_SOCKETSTATE_CLOSED)) &&
     (uVar5 = channels & sock->openChannels, uVar5 != 0)) {
    uVar6 = ~uVar5;
    __how = 2;
    if ((uVar6 & 3) != 0) {
      __how = uVar5 >> 1 & 1;
    }
    iVar2 = shutdown(sock->handle,__how);
    if (iVar2 == 0) {
      bVar1 = true;
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 0x6b) {
        bVar1 = true;
        uVar6 = 0xfffffffc;
      }
      else {
        deMutex_unlock(sock->stateLock);
        uVar6 = 0xffffffff;
        bVar1 = false;
      }
    }
    if (!bVar1) {
      return 0;
    }
    sock->openChannels = sock->openChannels & uVar6;
    dVar4 = 1;
    if (sock->openChannels == 0) {
      sock->state = DE_SOCKETSTATE_DISCONNECTED;
    }
  }
  deMutex_unlock(sock->stateLock);
  return dVar4;
}

Assistant:

deBool deSocket_shutdown (deSocket* sock, deUint32 channels)
{
	deUint32 closedChannels = 0;

	deMutex_lock(sock->stateLock);

	if (sock->state == DE_SOCKETSTATE_DISCONNECTED ||
		sock->state == DE_SOCKETSTATE_CLOSED)
	{
		deMutex_unlock(sock->stateLock);
		return DE_FALSE;
	}

	DE_ASSERT(channels != 0 && (channels & ~(deUint32)DE_SOCKETCHANNEL_BOTH) == 0);

	/* Don't attempt to close already closed channels on partially open socket. */
	channels &= sock->openChannels;

	if (channels == 0)
	{
		deMutex_unlock(sock->stateLock);
		return DE_FALSE;
	}

#if defined(DE_USE_WINSOCK)
	{
		int how = 0;

		if ((channels & DE_SOCKETCHANNEL_BOTH) == DE_SOCKETCHANNEL_BOTH)
			how = SD_BOTH;
		else if (channels & DE_SOCKETCHANNEL_SEND)
			how = SD_SEND;
		else if (channels & DE_SOCKETCHANNEL_RECEIVE)
			how = SD_RECEIVE;

		if (shutdown(sock->handle, how) == 0)
			closedChannels = channels;
		else
		{
			int err = WSAGetLastError();

			/* \note Due to asynchronous behavior certain errors are perfectly ok. */
			if (err == WSAECONNABORTED || err == WSAECONNRESET || err == WSAENOTCONN)
				closedChannels = DE_SOCKETCHANNEL_BOTH;
			else
			{
				deMutex_unlock(sock->stateLock);
				return DE_FALSE;
			}
		}
	}
#else
	{
		int how = 0;

		if ((channels & DE_SOCKETCHANNEL_BOTH) == DE_SOCKETCHANNEL_BOTH)
			how = SHUT_RDWR;
		else if (channels & DE_SOCKETCHANNEL_SEND)
			how = SHUT_WR;
		else if (channels & DE_SOCKETCHANNEL_RECEIVE)
			how = SHUT_RD;

		if (shutdown(sock->handle, how) == 0)
			closedChannels = channels;
		else
		{
			if (errno == ENOTCONN)
				closedChannels = DE_SOCKETCHANNEL_BOTH;
			else
			{
				deMutex_unlock(sock->stateLock);
				return DE_FALSE;
			}
		}
	}
#endif

	sock->openChannels &= ~closedChannels;
	if (sock->openChannels == 0)
		sock->state = DE_SOCKETSTATE_DISCONNECTED;

	deMutex_unlock(sock->stateLock);
	return DE_TRUE;
}